

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

void * cod_ev_get_data(cod_exec_context ec,int absp,int queue,int index)

{
  ev_state_data *ev_state;
  queue_item *pqVar1;
  event_item *peVar2;
  void *pvVar3;
  
  ev_state = (ev_state_data *)cod_get_client_data(ec,0x34567890);
  pqVar1 = cod_find_index(absp,ev_state,queue,index);
  if (pqVar1 == (queue_item *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    peVar2 = pqVar1->item;
    if (peVar2 == (event_item *)0x0) {
      __assert_fail("item->item",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x3b8,"void *cod_ev_get_data(cod_exec_context, int, int, int)");
    }
    pvVar3 = peVar2->decoded_event;
    if (pvVar3 == (void *)0x0) {
      peVar2 = cod_decode_event(ev_state->cm,ev_state->stone,ev_state->proto_action_id,peVar2);
      pqVar1->item = peVar2;
      pvVar3 = peVar2->decoded_event;
      if (pvVar3 == (void *)0x0) {
        __assert_fail("item->item->decoded_event",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                      ,0x3be,"void *cod_ev_get_data(cod_exec_context, int, int, int)");
      }
    }
  }
  return pvVar3;
}

Assistant:

static void *cod_ev_get_data(cod_exec_context ec, int absp, int queue, int index)
{
    struct ev_state_data *ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    queue_item *item;
    item = cod_find_index(absp, ev_state, queue, index);

    if (!item) {
	return NULL;
    }
    assert(item->item);

    if (!item->item->decoded_event) {
        item->item = cod_decode_event(ev_state->cm, ev_state->stone,
				      ev_state->proto_action_id, item->item);
    }
    assert(item->item->decoded_event);

    return item->item->decoded_event;
}